

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

t_int * times_perf8(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  t_sample g7;
  t_sample g6;
  t_sample g5;
  t_sample g4;
  t_sample g3;
  t_sample g2;
  t_sample g1;
  t_sample g0;
  t_sample f7;
  t_sample f6;
  t_sample f5;
  t_sample f4;
  t_sample f3;
  t_sample f2;
  t_sample f1;
  t_sample f0;
  int n;
  t_sample *out;
  t_sample *in2;
  t_sample *in1;
  t_int *w_local;
  
  in2 = (t_sample *)w[1];
  out = (t_sample *)w[2];
  _f0 = (float *)w[3];
  for (f1 = (t_sample)w[4]; f1 != 0.0; f1 = (t_sample)((int)f1 + -8)) {
    fVar1 = in2[1];
    fVar2 = in2[2];
    fVar3 = in2[3];
    fVar4 = in2[4];
    fVar5 = in2[5];
    fVar6 = in2[6];
    fVar7 = in2[7];
    fVar8 = out[1];
    fVar9 = out[2];
    fVar10 = out[3];
    fVar11 = out[4];
    fVar12 = out[5];
    fVar13 = out[6];
    fVar14 = out[7];
    *_f0 = *in2 * *out;
    _f0[1] = fVar1 * fVar8;
    _f0[2] = fVar2 * fVar9;
    _f0[3] = fVar3 * fVar10;
    _f0[4] = fVar4 * fVar11;
    _f0[5] = fVar5 * fVar12;
    _f0[6] = fVar6 * fVar13;
    _f0[7] = fVar7 * fVar14;
    in2 = in2 + 8;
    out = out + 8;
    _f0 = _f0 + 8;
  }
  return w + 5;
}

Assistant:

t_int *times_perf8(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    for (; n; n -= 8, in1 += 8, in2 += 8, out += 8)
    {
        t_sample f0 = in1[0], f1 = in1[1], f2 = in1[2], f3 = in1[3];
        t_sample f4 = in1[4], f5 = in1[5], f6 = in1[6], f7 = in1[7];

        t_sample g0 = in2[0], g1 = in2[1], g2 = in2[2], g3 = in2[3];
        t_sample g4 = in2[4], g5 = in2[5], g6 = in2[6], g7 = in2[7];

        out[0] = f0 * g0; out[1] = f1 * g1; out[2] = f2 * g2; out[3] = f3 * g3;
        out[4] = f4 * g4; out[5] = f5 * g5; out[6] = f6 * g6; out[7] = f7 * g7;
    }
    return (w+5);
}